

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  void *pvVar1;
  u8 uVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  u32 uVar6;
  BtShared *pBVar7;
  PgHdr *pPVar8;
  u16 *puVar9;
  _func_void_void_ptr *p_Var10;
  char cVar11;
  u16 uVar12;
  ushort uVar13;
  u16 uVar14;
  undefined2 uVar15;
  int iVar16;
  BtCursor *pBVar17;
  undefined1 *puVar18;
  MemPage **ppMVar19;
  ulong uVar20;
  undefined8 uVar21;
  _func_void_void_ptr *p_Var22;
  undefined8 *puVar23;
  long *plVar24;
  uint *puVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long *plVar29;
  MemPage *pCell_00;
  uint *puVar30;
  u8 *puVar31;
  uint uVar32;
  ulong uVar33;
  long *plVar34;
  uint uVar35;
  MemPage *pMVar36;
  BtShared *pBVar37;
  MemPage *pMVar38;
  BtShared *pBVar39;
  u8 *puVar40;
  MemPage *pMVar41;
  long lVar42;
  undefined4 *puVar43;
  ulong uVar44;
  long lVar45;
  Pgno PVar46;
  int nCell;
  size_t __n;
  u8 *puVar47;
  MemPage *pMVar48;
  int iVar49;
  int iVar50;
  MemPage *pMVar51;
  long in_FS_OFFSET;
  bool bVar52;
  Pgno pgnoNew;
  u8 *pCell;
  int szNew [5];
  u8 abDone [5];
  int rc;
  MemPage *pChild;
  MemPage *pNew;
  u16 szCell;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  Pgno aPgno [5];
  u8 aBalanceQuickSpace [13];
  int local_2d4;
  MemPage *local_2d0;
  MemPage *local_2c8;
  BtCursor *local_2c0;
  uint *local_2b8;
  MemPage *local_2b0;
  MemPage *local_2a8;
  uint local_29c;
  BtShared *local_298;
  MemPage *local_290;
  MemPage *local_288;
  MemPage *local_280;
  BtShared *local_278;
  uint *local_270;
  MemPage *local_268;
  MemPage *local_260;
  ulong local_258;
  uint local_24c;
  Pgno local_248;
  uint local_244 [7];
  undefined1 local_228 [128];
  _func_void_MemPage_ptr_u8_ptr_CellInfo_ptr *local_1a8;
  long local_1a0;
  void *local_198;
  void *local_190;
  CellArray local_188;
  long lStack_120;
  undefined8 local_118;
  long local_110 [4];
  u16 *local_f0;
  MemPage **local_e8;
  uint local_dc;
  undefined1 local_d8 [32];
  Pgno PStack_b8;
  uint local_b4 [5];
  long alStack_a0 [4];
  MemPage **local_80;
  u16 auStack_72 [5];
  Pgno aPStack_68 [8];
  u8 local_45 [4];
  u8 auStack_41 [9];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = pCur->apPage;
  local_e8 = pCur->apPage + 1;
  local_198 = (void *)0x0;
  local_2c0 = pCur;
LAB_00147dec:
  pBVar39 = (BtShared *)pCur->pPage;
  if (((*(int *)((long)&pBVar39->pCursor + 4) < 0) &&
      (iVar16 = btreeComputeFreeSpace((MemPage *)pBVar39), iVar16 != 0)) ||
     ((uVar2 = *(u8 *)((long)&pBVar39->db + 4), uVar2 == '\0' &&
      (iVar16 = *(int *)((long)&pBVar39->pCursor + 4) * 3, uVar6 = pCur->pBt->usableSize,
      iVar49 = uVar6 * 2,
      iVar16 == iVar49 || SBORROW4(iVar16,iVar49) != (int)(iVar16 + uVar6 * -2) < 0)))) {
LAB_00148005:
    bVar52 = false;
    iVar16 = 0;
    goto LAB_00148c95;
  }
  lVar42 = (long)pCur->iPage;
  if (lVar42 != 0) {
    pMVar41 = pCur->apPage[lVar42 + -1];
    local_268 = (MemPage *)(ulong)pCur->aiIdx[lVar42 + -1];
    iVar16 = sqlite3PagerWrite(pMVar41->pDbPage);
    if ((iVar16 == 0) && (iVar16 = 0, pMVar41->nFree < 0)) {
      iVar16 = btreeComputeFreeSpace(pMVar41);
    }
    if (iVar16 == 0) {
      if ((((*(u8 *)((long)&pBVar39->pPager + 2) != '\0') &&
           (*(u8 *)((long)&pBVar39->db + 4) == '\x01')) &&
          (*(u16 *)((long)&pBVar39->pPage1 + 4) == *(u16 *)&pBVar39->pPage1)) &&
         ((pMVar41->pgno != 1 && (pMVar41->nCell == (u16)local_268)))) {
        if (*(u16 *)&pBVar39->pPage1 == 0) {
          iVar16 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12304);
        }
        else {
          pBVar7 = (BtShared *)pBVar39->pSchema;
          iVar16 = allocateBtreePage(pBVar7,(MemPage **)&local_118,&local_248,0,'\0');
          local_228._104_4_ = iVar16;
          if (iVar16 == 0) {
            local_228._0_8_ = *(undefined8 *)&pBVar39->btsFlags;
            local_d8._0_2_ = (*(code *)pBVar39->pLock)(pBVar39);
            pMVar38 = (MemPage *)CONCAT44(local_118._4_4_,(int)local_118);
            zeroPage(pMVar38,0xd);
            local_188.nCell = 1;
            local_188.apCell = (u8 **)local_228;
            local_188.szCell = (u16 *)local_d8;
            local_188.apEnd[0] = (u8 *)pBVar39->mutex;
            local_188.ixNx[0] = 2;
            local_188.pRef = (MemPage *)pBVar39;
            iVar16 = rebuildPage(&local_188,0,1,pMVar38);
            local_228._104_4_ = iVar16;
            if (iVar16 == 0) {
              pMVar38->nFree =
                   (pBVar7->usableSize - ((uint)(ushort)local_d8._0_2_ + (uint)pMVar38->cellOffset))
                   + -2;
              if ((pBVar7->autoVacuum != '\0') &&
                 (ptrmapPut(pBVar7,local_248,'\x05',pMVar41->pgno,(int *)(local_228 + 0x68)),
                 pMVar38->minLocal < (ushort)local_d8._0_2_)) {
                ptrmapPutOvflPtr(pMVar38,pMVar38,(u8 *)local_228._0_8_,(int *)(local_228 + 0x68));
              }
              uVar44 = (ulong)(CONCAT11(*(u8 *)((long)pBVar39->pHasContent +
                                               (ulong)*(ushort *)&pBVar39->pPage1 * 2 + -2),
                                        *(u8 *)((long)pBVar39->pHasContent +
                                               (ulong)*(ushort *)&pBVar39->pPage1 * 2 + -1)) &
                              *(u16 *)((long)&pBVar39->pPage1 + 2));
              uVar33 = 0;
              p_Var10 = pBVar39->xFreeSchema + uVar44;
              pBVar7 = (BtShared *)(pBVar39->xFreeSchema + uVar44 + 2);
              do {
                pBVar37 = pBVar7;
                p_Var22 = p_Var10;
                if (7 < uVar33) break;
                uVar33 = uVar33 + 1;
                p_Var10 = p_Var22 + 1;
                pBVar7 = (BtShared *)((long)&pBVar37->pPager + 1);
              } while ((char)*p_Var22 < '\0');
              lVar42 = 4;
              do {
                local_228._0_8_ = pBVar37;
                uVar2 = ((BtShared *)(local_228._0_8_ + -0x98))->field_0x97;
                local_45[lVar42] = uVar2;
                lVar42 = lVar42 + 1;
                if (-1 < (char)uVar2) break;
                pBVar37 = (BtShared *)((long)&((BtShared *)local_228._0_8_)->pPager + 1);
              } while ((ulong)local_228._0_8_ < (BtShared *)(p_Var22 + 10));
              if (local_228._104_4_ == 0) {
                insertCell(pMVar41,(uint)pMVar41->nCell,local_45,(int)lVar42,(u8 *)0x0,
                           *(Pgno *)((long)&pBVar39->pPager + 4),(int *)(local_228 + 0x68));
              }
              *(Pgno *)(pMVar41->aData + (ulong)pMVar41->hdrOffset + 8) =
                   local_248 >> 0x18 | (local_248 & 0xff0000) >> 8 | (local_248 & 0xff00) << 8 |
                   local_248 << 0x18;
            }
            if (pMVar38 != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull(pMVar38->pDbPage);
            }
            if (iVar16 != 0) goto LAB_00148c5c;
          }
          iVar16 = local_228._104_4_;
        }
        goto LAB_00148c5c;
      }
      local_190 = pcache1Alloc(pCur->pBt->pageSize);
      local_2d4 = 0;
      local_228._80_4_ = 0;
      local_228[0x54] = 0;
      local_188._0_8_ = (MemPage *)0x0;
      local_188.pRef = (MemPage *)0x0;
      local_188.apCell = (u8 **)0x0;
      local_188.szCell = (u16 *)0x0;
      local_188.apEnd[0] = (u8 *)0x0;
      local_188.apEnd[1] = (u8 *)0x0;
      local_188.apEnd[2] = (u8 *)0x0;
      local_188.apEnd[3] = (u8 *)0x0;
      local_188.apEnd[4] = (u8 *)0x0;
      local_188.apEnd[5] = (u8 *)0x0;
      local_188.ixNx[0] = 0;
      local_188.ixNx[1] = 0;
      local_188.ixNx[2] = 0;
      local_188.ixNx[3] = 0;
      local_188.ixNx[4] = 0;
      local_188.ixNx[5] = 0;
      if (local_190 != (void *)0x0) {
        uVar32 = pCur->hints & 1;
        local_258 = (ulong)uVar32;
        uVar35 = (uint)pMVar41->nCell + (uint)pMVar41->nOverflow;
        local_270 = (uint *)0x0;
        if (1 < uVar35) {
          uVar26 = (uint)local_268;
          if (uVar26 == 0) {
            local_270 = (uint *)0x0;
          }
          else if (uVar35 == uVar26) {
            local_270 = (uint *)(ulong)((uVar35 + uVar32) - 2);
          }
          else {
            local_270 = (uint *)(ulong)(uVar26 - 1);
          }
          uVar35 = 2 - uVar32;
        }
        local_d8._24_8_ = ZEXT48(uVar35);
        iVar16 = (int)local_270;
        uVar32 = (iVar16 - (uint)pMVar41->nOverflow) + uVar35;
        local_1a0 = lVar42;
        if (uVar32 == pMVar41->nCell) {
          uVar44 = (ulong)pMVar41->hdrOffset + 8;
        }
        else {
          uVar44 = (ulong)(CONCAT11(pMVar41->aCellIdx[(long)(int)uVar32 * 2],
                                    pMVar41->aCellIdx[(long)(int)uVar32 * 2 + 1]) &
                          pMVar41->maskPage);
        }
        local_278 = pMVar41->pBt;
        local_24c = uVar35 + 1;
        local_1a8 = (_func_void_MemPage_ptr_u8_ptr_CellInfo_ptr *)(pMVar41->aData + uVar44);
        uVar32 = *(uint *)(pMVar41->aData + uVar44);
        local_29c = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                    uVar32 << 0x18;
        local_2b0 = (MemPage *)CONCAT44(local_2b0._4_4_,local_29c);
        __n = (size_t)(uVar35 * 8);
        uVar32 = iVar16 + -1 + uVar35;
        local_2d0 = (MemPage *)CONCAT44(local_2d0._4_4_,(iVar16 + uVar35) * 2 + -2);
        local_228._64_8_ = local_d8._24_8_;
        local_2b8 = (uint *)(local_228 + local_d8._24_8_ * 4 + 0x1c);
        iVar16 = 0;
        local_298 = pBVar39;
        local_260 = pMVar41;
        do {
          if (local_2d4 == 0) {
            local_2d4 = getAndInitPage(local_278,(Pgno)local_2b0,(MemPage **)(local_228 + __n),
                                       (BtCursor *)0x0,0);
          }
          if (local_2d4 != 0) {
            local_29c = (Pgno)local_2b0;
            __n = __n + 8;
LAB_00148b8f:
            memset(local_228,0,__n);
            goto LAB_00148bb1;
          }
          pMVar38 = *(MemPage **)(local_228 + __n);
          if ((pMVar38->nFree < 0) && (local_2d4 = btreeComputeFreeSpace(pMVar38), local_2d4 != 0))
          {
            local_29c = (Pgno)local_2b0;
            goto LAB_00148b8f;
          }
          iVar49 = iVar16 + (uint)pMVar38->nCell;
          iVar16 = iVar49 + 4;
          if (__n == 0) goto LAB_0014844c;
          if ((pMVar41->nOverflow == 0) || (uVar32 != pMVar41->aiOvfl[0])) {
            puVar47 = pMVar41->aData;
            lVar42 = (long)(int)((uint)local_2d0 + (uint)pMVar41->nOverflow * -2);
            uVar13 = CONCAT11(pMVar41->aCellIdx[lVar42],pMVar41->aCellIdx[lVar42 + 1]) &
                     pMVar41->maskPage;
            puVar31 = puVar47 + uVar13;
            *(u8 **)((long)alStack_a0 + __n) = puVar31;
            local_2b0 = (MemPage *)CONCAT44(local_2b0._4_4_,*(undefined4 *)(puVar47 + uVar13));
            uVar12 = (*pMVar41->xCellSize)(pMVar41,puVar31);
            *local_2b8 = (uint)uVar12;
            pvVar1 = local_190;
            if (((local_278->btsFlags & 0xc) != 0) &&
               (iVar49 = (int)puVar31 - *(int *)&pMVar41->aData,
               (int)(iVar49 + (uint)uVar12) <= (int)local_278->usableSize)) {
              memcpy((void *)((long)iVar49 + (long)local_190),puVar31,(ulong)(uint)uVar12);
              *(long *)((long)alStack_a0 + __n) =
                   ((long)puVar31 - (long)local_260->aData) + (long)pvVar1;
              pMVar41 = local_260;
            }
            local_2b0 = (MemPage *)
                        CONCAT44(local_2b0._4_4_,
                                 (Pgno)local_2b0 >> 0x18 | ((Pgno)local_2b0 & 0xff0000) >> 8 |
                                 ((Pgno)local_2b0 & 0xff00) << 8 | (Pgno)local_2b0 << 0x18);
            dropCell(pMVar41,uVar32 - pMVar41->nOverflow,(uint)uVar12,&local_2d4);
            pBVar39 = local_298;
          }
          else {
            puVar25 = (uint *)pMVar41->apOvfl[0];
            *(uint **)((long)alStack_a0 + __n) = puVar25;
            uVar35 = *puVar25;
            local_2b0 = (MemPage *)
                        CONCAT44(local_2b0._4_4_,
                                 uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8
                                 | uVar35 << 0x18);
            uVar12 = (*pMVar41->xCellSize)(pMVar41,(u8 *)puVar25);
            *local_2b8 = (uint)uVar12;
            pMVar41->nOverflow = '\0';
          }
          __n = __n - 8;
          local_2d0 = (MemPage *)CONCAT44(local_2d0._4_4_,(uint)local_2d0 + -2);
          uVar32 = uVar32 - 1;
          local_2b8 = local_2b8 + -1;
        } while( true );
      }
      iVar16 = 7;
      goto LAB_00148c3a;
    }
    goto LAB_00148c5c;
  }
  if (uVar2 == '\0') goto LAB_00148005;
  iVar16 = 0;
  bVar52 = true;
  for (pBVar17 = pCur->pBt->pCursor; pBVar17 != (BtCursor *)0x0; pBVar17 = pBVar17->pNext) {
    if (((pBVar17 != pCur) && (pBVar17->eState == '\0')) && (pBVar17->pPage == pCur->pPage)) {
      bVar52 = false;
      iVar16 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
      break;
    }
  }
  if (bVar52) {
    local_188._0_8_ = (MemPage *)0x0;
    local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
    pBVar7 = (BtShared *)pBVar39->pSchema;
    local_118._0_4_ = sqlite3PagerWrite((PgHdr *)pBVar39->pNext);
    if ((int)local_118 == 0) {
      local_118._0_4_ =
           allocateBtreePage(pBVar7,(MemPage **)&local_188,(Pgno *)local_228,
                             *(Pgno *)((long)&pBVar39->pPager + 4),'\0');
      copyNodeContent((MemPage *)pBVar39,(MemPage *)local_188._0_8_,(int *)&local_118);
      if (pBVar7->autoVacuum != '\0') {
        ptrmapPut(pBVar7,local_228._0_4_,'\x05',*(Pgno *)((long)&pBVar39->pPager + 4),
                  (int *)&local_118);
      }
    }
    iVar16 = (int)local_118;
    uVar21 = local_188._0_8_;
    if ((int)local_118 == 0) {
      memcpy((u16 *)(local_188._0_8_ + 0x1c),(u16 *)((long)&pBVar39->pPage1 + 4),
             (ulong)((uint)*(u8 *)((long)&pBVar39->db + 4) * 2));
      memcpy((u8 **)(uVar21 + 0x28),&pBVar39->btsFlags,(ulong)*(u8 *)((long)&pBVar39->db + 4) << 3);
      *(u8 *)(uVar21 + 0xc) = *(u8 *)((long)&pBVar39->db + 4);
      zeroPage((MemPage *)pBVar39,**(u8 **)(uVar21 + 0x50) & 0xfffffff7);
      *(uint *)(pBVar39->xFreeSchema + (ulong)*(u8 *)((long)&pBVar39->db + 1) + 8) =
           (uint)local_228._0_4_ >> 0x18 | (local_228._0_4_ & 0xff0000) >> 8 |
           (local_228._0_4_ & 0xff00) << 8 | local_228._0_4_ << 0x18;
      *local_e8 = (MemPage *)uVar21;
      iVar16 = 0;
    }
    else {
      *local_e8 = (MemPage *)0x0;
      if ((MemPage *)local_188._0_8_ != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_188._0_8_ + 0x70));
      }
    }
    bVar52 = true;
    if (iVar16 != 0) goto LAB_00148c95;
    pCur->iPage = '\x01';
    pCur->ix = 0;
    pCur->aiIdx[0] = 0;
    pCur->apPage[0] = (MemPage *)pBVar39;
    iVar16 = 0;
    ppMVar19 = local_e8;
    goto LAB_00148c89;
  }
  bVar52 = false;
  goto LAB_00148c95;
LAB_0014844c:
  local_29c = (Pgno)local_2b0;
  uVar35 = iVar49 + 7;
  uVar32 = uVar35 & 0x7ffffffc;
  local_188.apCell = (u8 **)sqlite3Malloc((long)(int)(uVar32 * 10 + local_278->pageSize));
  if ((MemPage *)local_188.apCell == (MemPage *)0x0) {
    local_2d4 = 7;
LAB_00148bb1:
    uVar32 = 0;
    pCur = local_2c0;
  }
  else {
    local_2c8 = (MemPage *)(((MemPage *)local_188.apCell)->aiOvfl + (ulong)uVar32 * 4 + -0xe);
    local_188.szCell = (u16 *)local_2c8;
    local_228._88_8_ = local_2c8->aiOvfl + ((ulong)uVar32 - 0xe);
    local_188.pRef = (MemPage *)local_228._0_8_;
    local_228._100_4_ = (uint)*(byte *)(local_228._0_8_ + 8);
    local_280 = (MemPage *)((ulong)*(byte *)(local_228._0_8_ + 8) << 2);
    local_228._72_8_ = local_228._0_8_;
    local_2b8 = (uint *)(ulong)*(u8 *)((long)(Pager **)local_228._0_8_ + 2);
    local_2d0 = (MemPage *)(ulong)local_24c;
    local_f0 = ((MemPage *)local_188.apCell)->aiOvfl +
               (ulong)(uVar35 >> 2 & 0x1fffffff) * 0x14 + -0xe;
    pMVar41 = (MemPage *)0x0;
    iVar49 = 0;
    iVar16 = local_188.nCell;
    local_290 = (MemPage *)local_188.apCell;
    do {
      lVar42 = *(long *)(local_228 + (long)pMVar41 * 8);
      puVar31 = *(u8 **)(lVar42 + 0x50);
      if ((_func_void_void_ptr)*puVar31 == **(_func_void_void_ptr **)(local_228._72_8_ + 0x50)) {
        local_288 = (MemPage *)(ulong)*(ushort *)(lVar42 + 0x18);
        uVar13 = *(ushort *)(lVar42 + 0x1a);
        puVar47 = puVar31 + *(ushort *)(lVar42 + 0x12);
        local_2a8 = (MemPage *)(long)iVar16;
        local_2b0 = pMVar41;
        memset(local_2c8->aiOvfl + (long)((long)&local_2a8[-1].xCellSize + 2),0,
               (ulong)(((uint)*(ushort *)(lVar42 + 0x18) + (uint)*(byte *)(lVar42 + 0xc)) * 2));
        pMVar38 = local_2c8;
        bVar3 = *(byte *)(lVar42 + 0xc);
        if (bVar3 != 0) {
          uVar4 = *(ushort *)(lVar42 + 0x1c);
          if ((ushort)local_288 < uVar4) {
            bVar52 = false;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x124c3);
            local_2d4 = 0xb;
            pMVar41 = local_2b0;
            goto LAB_001487c7;
          }
          if (uVar4 != 0) {
            lVar45 = 0;
            do {
              *(u8 **)(local_290->aiOvfl + (long)local_2a8 * 4 + lVar45 * 4 + -0xe) =
                   puVar31 + (uVar13 & CONCAT11(*puVar47,puVar47[1]));
              puVar47 = puVar47 + 2;
              lVar45 = lVar45 + 1;
            } while ((uint)uVar4 != (uint)lVar45);
            iVar16 = iVar16 + (uint)lVar45;
          }
          uVar32 = (uint)bVar3;
          if (bVar3 < 2) {
            uVar32 = 1;
          }
          uVar44 = 0;
          do {
            *(undefined8 *)(local_290->aiOvfl + (long)iVar16 * 4 + uVar44 * 4 + -0xe) =
                 *(undefined8 *)(lVar42 + 0x28 + uVar44 * 8);
            uVar44 = uVar44 + 1;
          } while (uVar32 != uVar44);
          iVar16 = iVar16 + (int)uVar44;
          local_188._0_8_ = (MemPage *)CONCAT44(local_188._4_4_,iVar16);
        }
        uVar4 = *(ushort *)(lVar42 + 0x12);
        uVar5 = *(ushort *)(lVar42 + 0x18);
        if (puVar47 < puVar31 + (ulong)uVar5 * 2 + (ulong)uVar4) {
          lVar45 = (long)iVar16;
          lVar27 = 0;
          do {
            puVar40 = puVar47 + lVar27;
            *(u8 **)(local_290->aiOvfl + lVar45 * 4 + lVar27 * 2 + -0xe) =
                 puVar31 + (CONCAT11(*puVar40,puVar40[1]) & uVar13);
            iVar16 = iVar16 + 1;
            local_188.nCell = iVar16;
            lVar27 = lVar27 + 2;
          } while (puVar40 + 2 < puVar31 + (ulong)uVar5 * 2 + (ulong)uVar4);
        }
        *(int *)(local_d8 + (long)local_2b0 * 4) = iVar16;
        bVar52 = true;
        pMVar41 = local_2b0;
        if ((local_2b0 < (ulong)local_228._64_8_) && ((char)local_2b8 == '\0')) {
          uVar32 = *(uint *)(local_228 + (long)((long)&local_2b0[-1].xParseCell + 7) * 4 + 0x24) &
                   0xffff;
          lVar45 = (long)iVar16;
          local_2c8->aiOvfl[lVar45 + -0xe] =
               (u16)*(uint *)(local_228 + (long)((long)&local_2b0[-1].xParseCell + 7) * 4 + 0x24);
          pvVar1 = (void *)(local_228._88_8_ + (long)iVar49);
          iVar49 = iVar49 + uVar32;
          memcpy(pvVar1,(void *)alStack_a0[(long)&local_2b0->intKey],(ulong)uVar32);
          puVar43 = (undefined4 *)((long)pvVar1 + (long)local_280);
          *(undefined4 **)(local_290->aiOvfl + lVar45 * 4 + -0xe) = puVar43;
          uVar13 = pMVar38->aiOvfl[lVar45 + -0xe] - (short)local_280;
          pMVar38->aiOvfl[lVar45 + -0xe] = uVar13;
          if (*(char *)(lVar42 + 8) == '\0') {
            *puVar43 = *(undefined4 *)(*(long *)(lVar42 + 0x50) + 8);
          }
          else if (uVar13 < 4) {
            puVar18 = (undefined1 *)((long)iVar49 + (long)local_f0);
            do {
              *puVar18 = 0;
              uVar13 = pMVar38->aiOvfl[lVar45 + -0xe] + 1;
              pMVar38->aiOvfl[lVar45 + -0xe] = uVar13;
              puVar18 = puVar18 + 1;
              iVar49 = iVar49 + 1;
            } while (uVar13 < 4);
          }
          bVar52 = true;
          iVar16 = iVar16 + 1;
          local_188.nCell = iVar16;
          pMVar41 = local_2b0;
        }
      }
      else {
        bVar52 = false;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x124ab);
        local_2d4 = 0xb;
      }
LAB_001487c7:
      if (!bVar52) {
        uVar32 = 0;
        pBVar39 = local_298;
        pCur = local_2c0;
        goto LAB_00148bd2;
      }
      pMVar41 = (MemPage *)&pMVar41->intKey;
    } while (pMVar41 != local_2d0);
    local_228._88_8_ = (u16 *)((ulong)local_280 & 0xffff);
    local_2b0 = (MemPage *)
                CONCAT44(local_2b0._4_4_,local_278->usableSize + (uint)(ushort)local_280 + -0xc);
    lVar42 = 0;
    iVar16 = 0;
    do {
      lVar45 = *(long *)(local_228 + lVar42 * 8);
      local_188.apEnd[iVar16] = (u8 *)*(undefined8 *)(lVar45 + 0x58);
      uVar32 = *(uint *)(local_d8 + lVar42 * 4);
      local_188.ixNx[iVar16] = uVar32;
      iVar49 = 0;
      if ((iVar16 != 0) &&
         (iVar49 = iVar16 + -1, uVar32 != local_188.ixNx[(long)iVar16 + 0xffffffffffffffff])) {
        iVar49 = iVar16;
      }
      iVar16 = iVar49;
      if ((int)local_2b8 == 0) {
        iVar16 = iVar49 + 1;
        local_188.apEnd[(long)iVar49 + 1] = local_260->aDataEnd;
        local_188.ixNx[(long)iVar49 + 1] = uVar32 + 1;
      }
      *(Pgno *)(local_228 + (lVar42 + -1) * 4 + 0x24) = (Pgno)local_2b0 - *(int *)(lVar45 + 0x14);
      if (*(char *)(lVar45 + 0xc) != '\0') {
        uVar44 = 0;
        do {
          uVar13 = (**(code **)(lVar45 + 0x78))(lVar45,*(undefined8 *)(lVar45 + 0x28 + uVar44 * 8));
          *(uint *)(local_228 + (lVar42 + -1) * 4 + 0x24) =
               (uint)uVar13 + *(int *)(local_228 + (lVar42 + -1) * 4 + 0x24) + 2;
          uVar44 = uVar44 + 1;
        } while (uVar44 < *(byte *)(lVar45 + 0xc));
      }
      local_244[lVar42 + -1] = uVar32;
      lVar42 = lVar42 + 1;
      iVar16 = iVar16 + 1;
    } while ((MemPage *)lVar42 != local_2d0);
    local_280 = (MemPage *)CONCAT44(local_280._4_4_,local_2d4);
    local_288 = (MemPage *)CONCAT44(local_288._4_4_,local_188.nCell);
    local_2c8 = (MemPage *)(long)local_188.nCell;
    local_290 = (MemPage *)-(long)local_2c8;
    uVar44 = 0;
    pMVar38 = (MemPage *)(ulong)local_24c;
    local_2d0 = (MemPage *)local_188.szCell;
    pMVar41 = (MemPage *)local_188.szCell;
    do {
      iVar16 = *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24);
      if ((int)(Pgno)local_2b0 < iVar16) {
        local_2a8 = (MemPage *)CONCAT44(local_2a8._4_4_,(int)uVar44 + 2);
        do {
          if ((long)(int)pMVar38 <= (long)(uVar44 + 1)) {
            if (3 < uVar44) {
              *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24) = iVar16;
              bVar52 = false;
              local_280 = (MemPage *)CONCAT44(local_280._4_4_,0xb);
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12528,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              pMVar38 = (MemPage *)((ulong)local_2a8 & 0xffffffff);
              pMVar41 = local_2d0;
              goto LAB_00148add;
            }
            *(undefined4 *)(local_228 + uVar44 * 4 + 0x24) = 0;
            local_244[uVar44] = (uint)local_288;
            pMVar38 = (MemPage *)((ulong)local_2a8 & 0xffffffff);
          }
          uVar32 = local_244[uVar44 - 1];
          uVar12 = pMVar41->aiOvfl[(long)(int)uVar32 + -0xf];
          if (uVar12 == 0) {
            uVar12 = computeCellSize(&local_188,uVar32 - 1);
            pMVar41 = local_2d0;
          }
          iVar49 = uVar12 + 2;
          if ((int)local_2b8 == 0) {
            iVar49 = 0;
            if ((int)uVar32 < (int)(uint)local_288) {
              uVar14 = pMVar41->aiOvfl[(long)(int)uVar32 + -0xe];
              if (uVar14 == 0) {
                uVar14 = computeCellSize(&local_188,uVar32);
                pMVar41 = local_2d0;
              }
              iVar49 = uVar14 + 2;
            }
          }
          *(int *)(local_228 + uVar44 * 4 + 0x24) = *(int *)(local_228 + uVar44 * 4 + 0x24) + iVar49
          ;
          iVar16 = iVar16 - (uVar12 + 2);
          local_244[uVar44 - 1] = uVar32 - 1;
        } while ((int)(Pgno)local_2b0 < iVar16);
      }
      *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24) = iVar16;
      uVar32 = local_244[uVar44 - 1];
      if ((int)uVar32 < (int)(uint)local_288) {
        bVar52 = true;
        lVar42 = (long)(int)uVar32;
        do {
          lVar45 = lVar42 + 1;
          uVar12 = pMVar41->aiOvfl[lVar42 + -0xe];
          if (uVar12 == 0) {
            uVar12 = computeCellSize(&local_188,uVar32);
            pMVar41 = local_2d0;
          }
          iVar16 = uVar12 + 2;
          if ((int)(Pgno)local_2b0 < *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24) + iVar16) {
            if (bVar52) {
              if (uVar44 == 0) {
                uVar35 = 0;
              }
              else {
                uVar35 = (&local_24c)[uVar44];
              }
              bVar52 = true;
              if ((int)uVar32 <= (int)uVar35) {
                bVar52 = false;
                local_280 = (MemPage *)CONCAT44(local_280._4_4_,0xb);
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12549,
                            "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                pMVar41 = local_2d0;
              }
              goto LAB_00148add;
            }
            break;
          }
          *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24) =
               *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24) + iVar16;
          local_244[uVar44 - 1] = uVar32 + 1;
          if (((int)local_2b8 == 0) && (iVar16 = 0, lVar45 < (long)local_2c8)) {
            uVar12 = pMVar41->aiOvfl[lVar42 + -0xd];
            if (uVar12 == 0) {
              uVar12 = computeCellSize(&local_188,uVar32 + 1);
              pMVar41 = local_2d0;
            }
            iVar16 = uVar12 + 2;
          }
          *(int *)(local_228 + uVar44 * 4 + 0x24) = *(int *)(local_228 + uVar44 * 4 + 0x24) - iVar16
          ;
          bVar52 = lVar45 < (long)local_2c8;
          lVar27 = lVar42 + -0x1b;
          uVar32 = uVar32 + 1;
          lVar42 = lVar45;
        } while ((long)local_290->aiOvfl + lVar27 != 0);
      }
      pMVar38 = (MemPage *)(ulong)((int)uVar44 + 1);
      bVar52 = true;
LAB_00148add:
      if (!bVar52) {
        local_2d4 = (int)local_280;
        pMVar41 = (MemPage *)0x0;
        goto LAB_00148bc8;
      }
      uVar44 = uVar44 + 1;
    } while ((long)uVar44 < (long)(int)pMVar38);
    local_2d4 = (int)local_280;
    local_280 = (MemPage *)(ulong)((int)pMVar38 - 1);
    iVar16 = (int)local_2b8;
    pMVar36 = pMVar41;
    pMVar48 = local_280;
    local_290 = pMVar38;
    do {
      if ((int)pMVar48 < 1) {
        local_2c8 = (MemPage *)
                    CONCAT44(local_2c8._4_4_,
                             (uint)(byte)**(_func_void_void_ptr **)(local_228._72_8_ + 0x50));
        if (0 < (int)pMVar38) {
          local_268 = (MemPage *)(ulong)(uint)((int)local_268 - (int)local_270);
          pMVar51 = (MemPage *)0x0;
          pMVar36 = (MemPage *)0x0;
          goto LAB_00148e63;
        }
        pMVar41 = (MemPage *)0x0;
        goto LAB_00149208;
      }
      iVar49 = *(int *)(local_228 + (long)pMVar48 * 4 + 0x1c);
      iVar50 = *(int *)(local_228 + (long)((long)&pMVar48[-1].xParseCell + 7) * 4 + 0x24);
      uVar32 = (&local_24c)[(long)pMVar48];
      lVar42 = (long)(int)uVar32 - ((ulong)local_2b8 & 0xffffffff);
      if (*(short *)((long)pMVar36 + lVar42 * 2) == 0) {
        computeCellSize(&local_188,(int)lVar42);
        pMVar36 = local_2d0;
        pMVar38 = local_290;
      }
      pMVar51 = (MemPage *)((long)&pMVar48[-1].xParseCell + 7);
      local_2c8 = (MemPage *)(ulong)((uint)(pMVar48 == local_280) * 2 - 2);
      lVar42 = (long)(int)uVar32 + 1;
      local_2a8 = pMVar48;
      do {
        uVar32 = uVar32 - 1;
        if (pMVar36->aiOvfl[lVar42 + -0x10] == 0) {
          computeCellSize(&local_188,uVar32);
          pMVar36 = local_2d0;
          pMVar38 = local_290;
        }
        if ((iVar50 != 0) &&
           (((char)local_258 != '\0' ||
            ((int)(((int)local_2c8 + iVar49) - (uint)pMVar36->aiOvfl[lVar42 + -0x10]) <
             (int)((uint)*(ushort *)((long)pMVar41 + lVar42 * 2 + (-2 - (ulong)(uint)(iVar16 * 2)))
                   + iVar50 + 2))))) break;
        iVar50 = iVar50 + (uint)*(ushort *)
                                 ((long)pMVar41 + lVar42 * 2 + (-2 - (ulong)(uint)(iVar16 * 2))) + 2
        ;
        iVar49 = (iVar49 - (uint)pMVar36->aiOvfl[lVar42 + -0x10]) + -2;
        local_244[(long)((long)&pMVar51[-1].xParseCell + 7)] = uVar32;
        lVar42 = lVar42 + -1;
      } while (1 < lVar42);
      *(int *)(local_228 + (long)((long)&local_2a8[-1].xParseCell + 7) * 4 + 0x24) = iVar50;
      *(int *)(local_228 + (long)((long)&pMVar51[-1].xParseCell + 7) * 4 + 0x24) = iVar49;
      uVar32 = 0;
      if (local_2a8 != (MemPage *)0x1) {
        uVar32 = local_244[(ulong)((int)local_2a8 - 2) - 1];
      }
      pMVar48 = pMVar51;
    } while ((int)uVar32 < (int)local_244[(long)((long)&pMVar51[-1].xParseCell + 7)]);
    pMVar41 = (MemPage *)0x0;
    uVar21 = 0x12573;
LAB_00149343:
    pBVar39 = local_298;
    pCur = local_2c0;
    uVar32 = (uint)pMVar41;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar21);
    local_2d4 = 0xb;
  }
  goto LAB_00148bd2;
  while (pMVar51 = (MemPage *)&pMVar51->intKey, pMVar36 = pMVar41,
        (MemPage *)((ulong)pMVar38 & 0xffffffff) != pMVar51) {
LAB_00148e63:
    pBVar39 = local_278;
    if ((ulong)local_228._64_8_ < pMVar51) {
      PVar46 = 1;
      if ((char)local_258 == '\0') {
        PVar46 = local_29c;
      }
      local_2d4 = allocateBtreePage(local_278,(MemPage **)(local_228 + 0x68),&local_29c,PVar46,'\0')
      ;
      uVar21 = local_228._104_8_;
      pMVar41 = pMVar36;
      if (local_2d4 == 0) {
        zeroPage((MemPage *)local_228._104_8_,(int)local_2c8);
        local_110[(long)((long)&pMVar51[-1].xParseCell + 7)] = uVar21;
        pMVar41 = (MemPage *)(ulong)((int)pMVar36 + 1);
        *(uint *)(local_d8 + (long)pMVar51 * 4) = (uint)local_288;
        pMVar36 = pMVar41;
        if ((pBVar39->autoVacuum == '\0') ||
           (ptrmapPut(pBVar39,*(Pgno *)(uVar21 + 4),'\x05',local_260->pgno,&local_2d4),
           local_2d4 == 0)) goto LAB_00148faf;
      }
      bVar52 = false;
      pMVar48 = pMVar41;
    }
    else {
      pMVar41 = *(MemPage **)(local_228 + (long)pMVar51 * 8);
      local_110[(long)((long)&pMVar51[-1].xParseCell + 7)] = (long)pMVar41;
      local_228._104_8_ = pMVar41;
      *(undefined8 *)(local_228 + (long)pMVar51 * 8) = 0;
      local_2d4 = sqlite3PagerWrite(pMVar41->pDbPage);
      if (((local_268 == pMVar51) + 1 != (int)pMVar41->pDbPage->nRef) && (local_2d4 == 0)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
        local_2d4 = 0xb;
      }
      pMVar41 = (MemPage *)(ulong)((int)pMVar36 + 1);
      if (local_2d4 == 0) {
LAB_00148faf:
        bVar52 = true;
        pMVar48 = pMVar36;
      }
      else {
        bVar52 = false;
        pMVar48 = pMVar36;
      }
    }
    if (!bVar52) goto LAB_00148bc8;
  }
LAB_00149208:
  if (0 < (int)pMVar41) {
    lVar42 = 0;
    do {
      lVar45 = local_110[lVar42 + -1];
      PVar46 = *(Pgno *)(lVar45 + 4);
      aPStack_68[lVar42] = PVar46;
      (&PStack_b8)[lVar42] = PVar46;
      auStack_72[lVar42] = *(u16 *)(*(long *)(lVar45 + 0x70) + 0x34);
      if (lVar42 != 0) {
        lVar45 = 0;
        do {
          if (aPStack_68[lVar45] == PVar46) {
            uVar21 = 0x125c2;
            goto LAB_00149343;
          }
          lVar45 = lVar45 + 1;
        } while (lVar42 != lVar45);
      }
      lVar42 = lVar42 + 1;
    } while ((MemPage *)lVar42 != pMVar41);
  }
  pBVar39 = local_278;
  PVar46 = local_29c;
  local_2d0 = pMVar41;
  if (0 < (int)pMVar41) {
    uVar44 = 0;
    do {
      uVar33 = 0;
      if ((uint)local_2d0 != 1) {
        uVar20 = 1;
        uVar28 = 0;
        do {
          uVar33 = uVar20 & 0xffffffff;
          if ((&PStack_b8)[(int)uVar28] <= (&PStack_b8)[uVar20]) {
            uVar33 = uVar28;
          }
          uVar20 = uVar20 + 1;
          uVar28 = uVar33;
        } while (pMVar41 != (MemPage *)uVar20);
      }
      lVar42 = (long)(int)uVar33;
      PVar46 = (&PStack_b8)[lVar42];
      (&PStack_b8)[lVar42] = 0xffffffff;
      if (uVar44 != uVar33) {
        if ((long)uVar44 < lVar42) {
          pPVar8 = *(PgHdr **)(local_110[lVar42 + -1] + 0x70);
          uVar6 = pBVar39->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)uVar33 + uVar6 + 1);
        }
        lVar45 = local_110[uVar44 - 1];
        pPVar8 = *(PgHdr **)(lVar45 + 0x70);
        pPVar8->flags = auStack_72[lVar42];
        sqlite3PcacheMove(pPVar8,PVar46);
        *(Pgno *)(lVar45 + 4) = PVar46;
        pBVar39 = local_278;
      }
      uVar44 = uVar44 + 1;
    } while ((MemPage *)uVar44 != pMVar41);
  }
  uVar35 = (uint)local_2d0;
  pMVar41 = (MemPage *)(long)(int)uVar35;
  lVar42 = (&lStack_120)[(long)pMVar41];
  uVar32 = *(uint *)(lVar42 + 4);
  *(uint *)local_1a8 =
       uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 | uVar32 << 0x18;
  if ((((ulong)local_2c8 & 8) == 0) && (local_24c != uVar35)) {
    puVar23 = (undefined8 *)local_228;
    if ((int)local_24c < (int)uVar35) {
      puVar23 = &local_118;
    }
    *(undefined4 *)(*(long *)(lVar42 + 0x50) + 8) =
         *(undefined4 *)(*(long *)(puVar23[local_228._64_8_] + 0x50) + 8);
  }
  local_29c = PVar46;
  local_290 = pMVar41;
  if (pBVar39->autoVacuum == '\0') {
LAB_001495ac:
    if (1 < (int)uVar35) {
      local_2c8 = (MemPage *)local_188.apCell;
      local_2a8 = (MemPage *)local_188.szCell;
      local_258 = (ulong)((int)local_2d0 - 1);
      uVar44 = 0;
      iVar49 = 0;
      do {
        pMVar41 = local_260;
        local_288 = (MemPage *)local_110[uVar44 - 1];
        uVar32 = local_244[uVar44 - 1];
        lVar42 = (long)(int)uVar32;
        puVar31 = *(u8 **)(local_2c8->aiOvfl + lVar42 * 4 + -0xe);
        uVar35 = (uint)local_2a8->aiOvfl[lVar42 + -0xe] + (int)local_228._88_8_;
        puVar40 = (u8 *)((long)iVar49 + (long)local_190);
        puVar47 = puVar40;
        if (local_288->leaf == '\0') {
          *(undefined4 *)(local_288->aData + 8) = *(undefined4 *)puVar31;
        }
        else if ((int)local_2b8 == 0) {
          puVar31 = puVar31 + -4;
          if (local_2a8->aiOvfl[lVar42 + -0xe] == 4) {
            uVar12 = (*local_260->xCellSize)(local_260,puVar31);
            uVar35 = (uint)uVar12;
          }
        }
        else {
          uVar32 = uVar32 - 1;
          (*local_288->xParseCell)
                    (local_288,*(u8 **)(local_2c8->aiOvfl + lVar42 * 4 + -0x12),
                     (CellInfo *)(local_228 + 0x68));
          iVar16 = sqlite3PutVarint(puVar40 + 4,local_228._104_8_);
          uVar35 = iVar16 + 4;
          pMVar41 = local_260;
          puVar47 = (u8 *)0x0;
          puVar31 = puVar40;
        }
        uVar33 = 0;
        do {
          uVar28 = uVar33;
          if (5 < uVar28) break;
          uVar33 = uVar28 + 1;
        } while (local_188.ixNx[uVar28] <= (int)uVar32);
        if ((puVar31 <= local_188.apEnd[uVar28]) &&
           (local_188.apEnd[uVar28] < puVar31 + (int)uVar35)) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1265f);
          local_2d4 = 0xb;
          pBVar39 = local_298;
          pCur = local_2c0;
          iVar16 = local_2d4;
          goto LAB_00149daa;
        }
        insertCell(pMVar41,(int)local_270 + (int)uVar44,puVar31,uVar35,puVar47,local_288->pgno,
                   &local_2d4);
        pBVar39 = local_298;
        pCur = local_2c0;
        iVar16 = local_2d4;
        if (local_2d4 != 0) goto LAB_00149daa;
        iVar49 = iVar49 + uVar35;
        uVar44 = uVar44 + 1;
      } while (uVar44 != local_258);
    }
    puVar9 = local_188.szCell;
    uVar32 = 1 - (int)local_2d0;
    pCur = local_2c0;
    iVar16 = local_2d4;
    if ((int)uVar32 < (int)local_2d0) {
      local_1a8 = (_func_void_MemPage_ptr_u8_ptr_CellInfo_ptr *)
                  CONCAT44(local_1a8._4_4_,(uint)((int)local_2b8 == 0));
      local_f0 = (u16 *)CONCAT44(local_f0._4_4_,local_188.nCell);
      local_dc = local_248;
      local_228._72_8_ = local_188.pRef;
      local_288 = (MemPage *)local_188.apCell;
      lVar42 = local_1a0;
      do {
        uVar21 = local_228._88_8_;
        uVar35 = -uVar32;
        if (0 < (int)uVar32) {
          uVar35 = uVar32;
        }
        uVar44 = (ulong)uVar35;
        if ((local_228[uVar44 + 0x50] == '\0') &&
           ((-1 < (int)uVar32 ||
            ((int)(&local_24c)[(int)uVar35] <= *(int *)(local_d8 + ((long)(int)uVar35 + -1) * 4)))))
        {
          if (uVar32 == 0) {
            local_2a8 = (MemPage *)0x0;
            iVar49 = 0;
            uVar35 = local_dc;
          }
          else {
            iVar49 = (int)local_f0;
            if (uVar35 <= (uint)local_d8._24_4_) {
              iVar49 = *(int *)(local_d8 + ((long)(int)uVar35 + -1) * 4) + (int)local_1a8;
            }
            local_2a8 = (MemPage *)(ulong)((&local_24c)[(int)uVar35] + (int)local_1a8);
            uVar35 = local_244[uVar44 - 1] - ((&local_24c)[(int)uVar35] + (int)local_1a8);
          }
          local_2b8 = (uint *)(ulong)uVar35;
          pMVar41 = (MemPage *)local_110[uVar44 - 1];
          local_228._64_8_ = pMVar41->aData;
          local_280 = (MemPage *)(ulong)pMVar41->hdrOffset;
          local_268 = (MemPage *)(pMVar41->aCellIdx + (int)(uVar35 * 2));
          uVar13 = pMVar41->nCell;
          iVar16 = (int)local_2a8;
          local_270 = (uint *)(ulong)(uint)(iVar49 - iVar16);
          local_258 = CONCAT44(local_258._4_4_,iVar49);
          puVar25 = (uint *)(ulong)uVar13;
          uVar35 = (uint)pMVar41->nOverflow;
          local_2c8 = pMVar41;
          if (iVar49 < iVar16) {
            local_228._89_3_ = 0;
            local_228[0x58] = pMVar41->nOverflow;
            local_228._92_4_ = SUB84(uVar21,4);
            iVar50 = pageFreeArray(pMVar41,iVar49,iVar16 - iVar49,&local_188);
            puVar25 = (uint *)(ulong)((uint)uVar13 - iVar50);
            if ((int)(uint)uVar13 < iVar50) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12293,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              puVar25 = (uint *)(ulong)uVar13;
            }
            else {
              memmove(pMVar41->aCellIdx,pMVar41->aCellIdx + iVar50 * 2,(ulong)((uint)uVar13 * 2));
            }
            iVar16 = 0xb;
            pMVar41 = local_2c8;
            uVar35 = local_228._88_4_;
            iVar49 = (int)local_258;
            if (iVar50 <= (int)(uint)uVar13) goto LAB_00149935;
          }
          else {
LAB_00149935:
            iVar50 = (uint)uVar13 + iVar49 + uVar35;
            iVar16 = (int)local_2b8 + (int)local_2a8;
            nCell = iVar50 - iVar16;
            if (nCell != 0 && iVar16 <= iVar50) {
              iVar16 = pageFreeArray(local_2c8,iVar16,nCell,&local_188);
              puVar25 = (uint *)(ulong)(uint)((int)puVar25 - iVar16);
              iVar49 = (int)local_258;
            }
            uVar13 = *(ushort *)((undefined1 *)((long)(local_228._64_8_ + 4) + 1) + (long)local_280)
            ;
            local_228._104_8_ =
                 (long)(local_228._64_8_ + 0x1c) +
                 ((ulong)((ushort)(uVar13 << 8 | uVar13 >> 8) - 1 & 0xffff) - 0x1b);
            puVar30 = local_2b8;
            pBVar39 = (BtShared *)local_228._72_8_;
            if ((local_268 <= (ulong)local_228._104_8_) &&
               ((ulong)local_228._104_8_ <= (MemPage *)local_2c8->aDataEnd)) {
              if ((int)local_2a8 < iVar49) {
                if ((int)local_2b8 <= (int)local_270) {
                  local_270 = local_2b8;
                }
                puVar31 = local_2c8->aCellIdx;
                iVar16 = (int)local_270;
                local_270 = puVar25;
                memmove(puVar31 + iVar16 * 2,puVar31,(long)((int)puVar25 * 2));
                pBVar39 = (BtShared *)local_228._72_8_;
                iVar49 = pageInsertArray(local_2c8,&local_268->isInit,(u8 **)(local_228 + 0x68),
                                         puVar31,(int)local_2a8,iVar16,&local_188);
                puVar30 = local_2b8;
                if (iVar49 != 0) goto LAB_00149ba0;
                puVar25 = (uint *)(ulong)(uint)(iVar16 + (int)local_270);
                iVar49 = (int)local_258;
              }
              iVar16 = (int)local_2b8;
              pMVar41 = local_2c8;
              if (local_2c8->nOverflow != '\0') {
                uVar33 = 0;
                puVar30 = local_2b8;
                do {
                  lVar42 = (long)iVar49 + (ulong)pMVar41->aiOvfl[uVar33];
                  iVar50 = (int)lVar42;
                  iVar16 = iVar50 - (int)local_2a8;
                  bVar52 = true;
                  if ((-1 < iVar16) && (iVar16 < (int)puVar30)) {
                    puVar31 = pMVar41->aCellIdx + (uint)(iVar16 * 2);
                    iVar49 = (int)puVar25 - iVar16;
                    if (iVar49 != 0 && iVar16 <= (int)puVar25) {
                      local_270 = puVar25;
                      memmove(puVar31 + 2,puVar31,(long)(iVar49 * 2));
                      puVar25 = local_270;
                    }
                    if (((u16 *)((long)puVar9 + 0x1c))[lVar42 + -0xe] == 0) {
                      local_270 = puVar25;
                      computeCellSize(&local_188,iVar50);
                      puVar25 = local_270;
                    }
                    puVar25 = (uint *)(ulong)((int)puVar25 + 1);
                    iVar16 = pageInsertArray(local_2c8,&local_268->isInit,(u8 **)(local_228 + 0x68),
                                             puVar31,iVar50,1,&local_188);
                    bVar52 = iVar16 == 0;
                    puVar30 = local_2b8;
                    pMVar41 = local_2c8;
                    iVar49 = (int)local_258;
                  }
                  iVar16 = (int)puVar30;
                  pBVar39 = (BtShared *)local_228._72_8_;
                  if (!bVar52) goto LAB_00149ba0;
                  uVar33 = uVar33 + 1;
                } while (uVar33 < pMVar41->nOverflow);
              }
              iVar49 = (int)puVar25;
              iVar16 = pageInsertArray(local_2c8,&local_268->isInit,(u8 **)(local_228 + 0x68),
                                       pMVar41->aCellIdx + iVar49 * 2,iVar49 + (int)local_2a8,
                                       iVar16 - iVar49,&local_188);
              puVar30 = local_2b8;
              if (iVar16 == 0) {
                local_2c8->nCell = (u16)local_2b8;
                local_2c8->nOverflow = '\0';
                ((undefined1 *)(local_228._64_8_ + 3))[(long)local_280] =
                     (char)((ulong)local_2b8 >> 8);
                *(char *)((long)(local_228._64_8_ + 4) + (long)local_280) = (char)local_2c8->nCell;
                uVar13 = (ushort)(local_228._104_4_ - (int)local_228._64_8_);
                *(ushort *)((undefined1 *)((long)(local_228._64_8_ + 4) + 1) + (long)local_280) =
                     uVar13 << 8 | uVar13 >> 8;
                iVar16 = 0;
                pMVar41 = local_2c8;
                goto LAB_00149bfe;
              }
            }
LAB_00149ba0:
            iVar16 = (int)puVar30;
            if (0 < iVar16) {
              lVar42 = (long)(int)local_2a8 * 2;
              iVar49 = iVar16 + 1;
              do {
                if (*(short *)((long)((long)puVar9 + 0x1c) + lVar42 + -0x1c) == 0) {
                  uVar15 = (*(code *)pBVar39->pLock)
                                     (pBVar39,*(undefined8 *)(local_288->aiOvfl + lVar42 * 2 + -0xe)
                                     );
                  *(undefined2 *)((long)((long)puVar9 + 0x1c) + lVar42 + -0x1c) = uVar15;
                  puVar30 = local_2b8;
                }
                iVar16 = (int)puVar30;
                lVar42 = lVar42 + 2;
                iVar49 = iVar49 + -1;
              } while (1 < iVar49);
            }
            pMVar41 = local_2c8;
            iVar16 = rebuildPage(&local_188,(int)local_2a8,iVar16,local_2c8);
          }
LAB_00149bfe:
          if (iVar16 == 0) {
            local_228[uVar44 + 0x50] = 1;
            pMVar41->nFree = (Pgno)local_2b0 - *(int *)(local_228 + (uVar44 - 1) * 4 + 0x24);
          }
          bVar52 = iVar16 != 0;
          lVar42 = local_1a0;
          pCur = local_2c0;
        }
        else {
          bVar52 = false;
        }
        cVar11 = (char)lVar42;
        pBVar39 = local_298;
        if (bVar52) goto LAB_00149daa;
        uVar32 = uVar32 + 1;
      } while (uVar32 != (uint)local_2d0);
    }
    else {
      cVar11 = (char)local_1a0;
    }
    pMVar41 = local_260;
    pBVar39 = local_278;
    local_2d4 = iVar16;
    if (((cVar11 == '\x01') && (local_260->nCell == 0)) &&
       (pMVar38 = (MemPage *)CONCAT44(local_118._4_4_,(int)local_118),
       (int)(uint)local_260->hdrOffset <= pMVar38->nFree)) {
      local_2d4 = defragmentPage(pMVar38,-1);
      copyNodeContent(pMVar38,pMVar41,&local_2d4);
      if (local_2d4 == 0) {
        local_2d4 = freePage2(pMVar38->pBt,pMVar38,pMVar38->pgno);
      }
    }
    else if (((0 < (int)(uint)local_2d0) && (local_278->autoVacuum != '\0')) &&
            (local_228[100] == '\0')) {
      uVar44 = (ulong)local_2d0 & 0xffffffff;
      uVar33 = 0;
      do {
        uVar32 = *(uint *)(*(long *)(local_110[uVar33 - 1] + 0x50) + 8);
        ptrmapPut(pBVar39,uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                          uVar32 << 0x18,'\x05',*(Pgno *)(local_110[uVar33 - 1] + 4),&local_2d4);
        uVar33 = uVar33 + 1;
      } while (uVar44 != uVar33);
    }
    pBVar39 = local_298;
    iVar49 = (int)local_2d0;
    iVar50 = (int)local_d8._24_8_;
    iVar16 = local_2d4;
    if (iVar49 <= iVar50) {
      lVar42 = (long)local_290 * 8;
      lVar45 = 0;
      do {
        if (iVar16 == 0) {
          pMVar41 = *(MemPage **)(local_228 + lVar45 * 8 + lVar42);
          iVar16 = freePage2(pMVar41->pBt,pMVar41,pMVar41->pgno);
        }
        lVar45 = lVar45 + 1;
      } while ((iVar50 - iVar49) + 1 != (int)lVar45);
    }
  }
  else {
    if (0 < (int)(uint)local_288) {
      bVar52 = (int)local_2b8 == 0;
      pMVar36 = (MemPage *)CONCAT44(local_118._4_4_,(int)local_118);
      pMVar51 = (MemPage *)(ulong)((uint)pMVar36->nCell + (uint)pMVar36->nOverflow);
      pMVar48 = (MemPage *)0x0;
      iVar16 = 0;
      local_288 = (MemPage *)((ulong)local_288 & 0xffffffff00000000);
      pMVar38 = pMVar36;
      do {
        if (pMVar48 == pMVar51) {
          lVar42 = (long)iVar16;
          plVar24 = (long *)(local_228 + lVar42 * 8 + 8);
          plVar29 = local_110 + lVar42;
          do {
            lVar42 = lVar42 + 1;
            plVar34 = plVar24;
            if (lVar42 < (long)pMVar41) {
              plVar34 = plVar29;
            }
            pMVar38 = (MemPage *)*plVar34;
            pMVar51 = (MemPage *)
                      (ulong)((int)pMVar51 + (uint)bVar52 + (uint)pMVar38->nCell +
                             (uint)pMVar38->nOverflow);
            iVar16 = iVar16 + 1;
            plVar24 = plVar24 + 1;
            plVar29 = plVar29 + 1;
          } while (pMVar48 == pMVar51);
        }
        pCell_00 = *(MemPage **)((u16 *)((long)local_188.apCell + 0x1c) + (long)pMVar48 * 4 + -0xe);
        lVar42 = (long)(int)(uint)local_288;
        if (pMVar48 == (MemPage *)(ulong)local_244[lVar42 + -1]) {
          local_288 = (MemPage *)CONCAT44(local_288._4_4_,(uint)local_288 + 1);
          pMVar36 = (MemPage *)local_110[lVar42];
          if ((int)local_2b8 != 0) goto LAB_001494aa;
          iVar49 = 0x35;
        }
        else {
LAB_001494aa:
          if (((((int)(uint)local_2d0 <= iVar16) || (pMVar36->pgno != aPStack_68[iVar16])) ||
              (pCell_00 < (MemPage *)pMVar38->aData)) ||
             (iVar49 = 0, (MemPage *)pMVar38->aDataEnd <= pCell_00)) {
            if (local_228[100] == '\0') {
              uVar32._0_1_ = pCell_00->isInit;
              uVar32._1_1_ = pCell_00->intKey;
              uVar32._2_1_ = pCell_00->intKeyLeaf;
              uVar32._3_1_ = pCell_00->field_0x3;
              local_2c8 = pCell_00;
              ptrmapPut(local_278,
                        uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                        uVar32 << 0x18,'\x05',pMVar36->pgno,&local_2d4);
              pCell_00 = local_2c8;
              pMVar41 = local_290;
            }
            uVar12 = ((u16 *)((long)local_188.szCell + 0x1c))
                     [(long)((long)&pMVar48[-1].xCellSize + 2)];
            if (uVar12 == 0) {
              local_2c8 = pCell_00;
              uVar12 = computeCellSize(&local_188,(int)pMVar48);
              pCell_00 = local_2c8;
              pMVar41 = local_290;
            }
            if (pMVar36->minLocal < uVar12) {
              ptrmapPutOvflPtr(pMVar36,pMVar38,&pCell_00->isInit,&local_2d4);
              pMVar41 = local_290;
            }
            iVar49 = (uint)(local_2d4 != 0) << 2;
          }
        }
        if ((iVar49 != 0x35) && (iVar49 != 0)) goto LAB_0014958c;
        pMVar48 = (MemPage *)&pMVar48->intKey;
      } while ((long)pMVar48 < (long)local_188.nCell);
    }
    iVar49 = 0;
LAB_0014958c:
    pBVar39 = local_298;
    pCur = local_2c0;
    iVar16 = local_2d4;
    if (iVar49 != 4) {
      uVar35 = (uint)local_2d0;
      iVar16 = (int)pMVar48;
      if (iVar49 != 0) goto LAB_00148c3a;
      goto LAB_001495ac;
    }
  }
LAB_00149daa:
  local_2d4 = iVar16;
  uVar32 = (uint)local_2d0;
LAB_00148bd2:
  if ((MemPage *)local_188.apCell != (MemPage *)0x0) {
    sqlite3_free(local_188.apCell);
  }
  uVar44 = (ulong)local_24c;
  uVar33 = 0;
  do {
    if (*(long *)(local_228 + uVar33 * 8) != 0) {
      sqlite3PagerUnrefNotNull(*(DbPage **)(*(long *)(local_228 + uVar33 * 8) + 0x70));
    }
    uVar33 = uVar33 + 1;
  } while (uVar44 != uVar33);
  iVar16 = local_2d4;
  if (0 < (int)uVar32) {
    uVar44 = 0;
    do {
      if (local_110[uVar44 - 1] != 0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_110[uVar44 - 1] + 0x70));
      }
      uVar44 = uVar44 + 1;
      iVar16 = local_2d4;
    } while (uVar32 != uVar44);
  }
LAB_00148c3a:
  if (local_198 != (void *)0x0) {
    pcache1Free(local_198);
  }
  local_198 = local_190;
LAB_00148c5c:
  *(u8 *)((long)&pBVar39->db + 4) = '\0';
  if (pBVar39 != (BtShared *)0x0) {
    sqlite3PagerUnrefNotNull((DbPage *)pBVar39->pNext);
  }
  cVar11 = pCur->iPage + -1;
  pCur->iPage = cVar11;
  ppMVar19 = local_80 + cVar11;
LAB_00148c89:
  pCur->pPage = *ppMVar19;
  bVar52 = true;
LAB_00148c95:
  if ((!bVar52) || (iVar16 != 0)) {
    if (local_198 != (void *)0x0) {
      pcache1Free(local_198);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar16;
    }
    __stack_chk_fail();
  }
  goto LAB_00147dec;
LAB_00148bc8:
  uVar32 = (uint)pMVar41;
  pBVar39 = local_298;
  pCur = local_2c0;
  goto LAB_00148bd2;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}